

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

bool __thiscall ipx::Basis::TightenLuPivotTol(Basis *this)

{
  ostream *poVar1;
  double dVar2;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  stringstream h_logging_stream;
  undefined1 local_188 [376];
  
  dVar2 = LuUpdate::pivottol((this->lu_)._M_t.
                             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                             .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  if (dVar2 <= 0.05) {
    dVar2 = 0.1;
  }
  else if (dVar2 <= 0.25) {
    dVar2 = 0.3;
  }
  else {
    if (0.5 < dVar2) {
      return false;
    }
    dVar2 = 0.9;
  }
  LuUpdate::pivottol((this->lu_)._M_t.
                     super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
                     super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,dVar2);
  std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
  local_1b8 = local_1a8;
  local_1b0 = 0;
  local_1a8[0] = 0;
  std::__cxx11::stringbuf::str((string *)(local_188 + 8));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::operator<<((ostream *)local_188," LU pivot tolerance tightened to ");
  dVar2 = LuUpdate::pivottol((this->lu_)._M_t.
                             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                             .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,'\n');
  Control::hLog(this->control_,&h_logging_stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
  return true;
}

Assistant:

bool Basis::TightenLuPivotTol() {
    double tol = lu_->pivottol();
    if (tol <= 0.05)
        lu_->pivottol(0.1);
    else if (tol <= 0.25)
        lu_->pivottol(0.3);
    else if (tol <= 0.5)
        lu_->pivottol(0.9);
    else
        return false;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream << " LU pivot tolerance tightened to " << lu_->pivottol() << '\n';
    control_.hLog(h_logging_stream);
    return true;
}